

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixTone.cpp
# Opt level: O1

void MakeWaveTables(void)

{
  double dVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    dVar1 = sin((double)(int)lVar5 * 6.283184 * 0.00390625);
    gWaveModelTable[0][lVar5] = (char)(int)(dVar1 * 64.0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    gWaveModelTable[1][lVar5] = (char)lVar5;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x40);
  cVar2 = '@';
  lVar5 = 0;
  do {
    gWaveModelTable[1][lVar5 + 0x40] = cVar2;
    lVar5 = lVar5 + 1;
    cVar2 = cVar2 + -1;
  } while ((int)lVar5 != 0x80);
  lVar5 = 0;
  do {
    gWaveModelTable[1][lVar5 + 0xc0] = (char)lVar5 + -0x40;
    lVar5 = lVar5 + 1;
  } while ((int)lVar5 != 0x40);
  uVar4 = 0;
  do {
    gWaveModelTable[2][uVar4] = (char)(uVar4 >> 1) + -0x40;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x100);
  uVar4 = 0;
  do {
    gWaveModelTable[3][uVar4] = '@' - (char)(uVar4 >> 1);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x100);
  gWaveModelTable[4][0x70] = '@';
  gWaveModelTable[4][0x71] = '@';
  gWaveModelTable[4][0x72] = '@';
  gWaveModelTable[4][0x73] = '@';
  gWaveModelTable[4][0x74] = '@';
  gWaveModelTable[4][0x75] = '@';
  gWaveModelTable[4][0x76] = '@';
  gWaveModelTable[4][0x77] = '@';
  gWaveModelTable[4][0x78] = '@';
  gWaveModelTable[4][0x79] = '@';
  gWaveModelTable[4][0x7a] = '@';
  gWaveModelTable[4][0x7b] = '@';
  gWaveModelTable[4][0x7c] = '@';
  gWaveModelTable[4][0x7d] = '@';
  gWaveModelTable[4][0x7e] = '@';
  gWaveModelTable[4][0x7f] = '@';
  gWaveModelTable[4][0x60] = '@';
  gWaveModelTable[4][0x61] = '@';
  gWaveModelTable[4][0x62] = '@';
  gWaveModelTable[4][99] = '@';
  gWaveModelTable[4][100] = '@';
  gWaveModelTable[4][0x65] = '@';
  gWaveModelTable[4][0x66] = '@';
  gWaveModelTable[4][0x67] = '@';
  gWaveModelTable[4][0x68] = '@';
  gWaveModelTable[4][0x69] = '@';
  gWaveModelTable[4][0x6a] = '@';
  gWaveModelTable[4][0x6b] = '@';
  gWaveModelTable[4][0x6c] = '@';
  gWaveModelTable[4][0x6d] = '@';
  gWaveModelTable[4][0x6e] = '@';
  gWaveModelTable[4][0x6f] = '@';
  gWaveModelTable[4][0x50] = '@';
  gWaveModelTable[4][0x51] = '@';
  gWaveModelTable[4][0x52] = '@';
  gWaveModelTable[4][0x53] = '@';
  gWaveModelTable[4][0x54] = '@';
  gWaveModelTable[4][0x55] = '@';
  gWaveModelTable[4][0x56] = '@';
  gWaveModelTable[4][0x57] = '@';
  gWaveModelTable[4][0x58] = '@';
  gWaveModelTable[4][0x59] = '@';
  gWaveModelTable[4][0x5a] = '@';
  gWaveModelTable[4][0x5b] = '@';
  gWaveModelTable[4][0x5c] = '@';
  gWaveModelTable[4][0x5d] = '@';
  gWaveModelTable[4][0x5e] = '@';
  gWaveModelTable[4][0x5f] = '@';
  gWaveModelTable[4][0x40] = '@';
  gWaveModelTable[4][0x41] = '@';
  gWaveModelTable[4][0x42] = '@';
  gWaveModelTable[4][0x43] = '@';
  gWaveModelTable[4][0x44] = '@';
  gWaveModelTable[4][0x45] = '@';
  gWaveModelTable[4][0x46] = '@';
  gWaveModelTable[4][0x47] = '@';
  gWaveModelTable[4][0x48] = '@';
  gWaveModelTable[4][0x49] = '@';
  gWaveModelTable[4][0x4a] = '@';
  gWaveModelTable[4][0x4b] = '@';
  gWaveModelTable[4][0x4c] = '@';
  gWaveModelTable[4][0x4d] = '@';
  gWaveModelTable[4][0x4e] = '@';
  gWaveModelTable[4][0x4f] = '@';
  gWaveModelTable[4][0x30] = '@';
  gWaveModelTable[4][0x31] = '@';
  gWaveModelTable[4][0x32] = '@';
  gWaveModelTable[4][0x33] = '@';
  gWaveModelTable[4][0x34] = '@';
  gWaveModelTable[4][0x35] = '@';
  gWaveModelTable[4][0x36] = '@';
  gWaveModelTable[4][0x37] = '@';
  gWaveModelTable[4][0x38] = '@';
  gWaveModelTable[4][0x39] = '@';
  gWaveModelTable[4][0x3a] = '@';
  gWaveModelTable[4][0x3b] = '@';
  gWaveModelTable[4][0x3c] = '@';
  gWaveModelTable[4][0x3d] = '@';
  gWaveModelTable[4][0x3e] = '@';
  gWaveModelTable[4][0x3f] = '@';
  gWaveModelTable[4][0x20] = '@';
  gWaveModelTable[4][0x21] = '@';
  gWaveModelTable[4][0x22] = '@';
  gWaveModelTable[4][0x23] = '@';
  gWaveModelTable[4][0x24] = '@';
  gWaveModelTable[4][0x25] = '@';
  gWaveModelTable[4][0x26] = '@';
  gWaveModelTable[4][0x27] = '@';
  gWaveModelTable[4][0x28] = '@';
  gWaveModelTable[4][0x29] = '@';
  gWaveModelTable[4][0x2a] = '@';
  gWaveModelTable[4][0x2b] = '@';
  gWaveModelTable[4][0x2c] = '@';
  gWaveModelTable[4][0x2d] = '@';
  gWaveModelTable[4][0x2e] = '@';
  gWaveModelTable[4][0x2f] = '@';
  gWaveModelTable[4][0x10] = '@';
  gWaveModelTable[4][0x11] = '@';
  gWaveModelTable[4][0x12] = '@';
  gWaveModelTable[4][0x13] = '@';
  gWaveModelTable[4][0x14] = '@';
  gWaveModelTable[4][0x15] = '@';
  gWaveModelTable[4][0x16] = '@';
  gWaveModelTable[4][0x17] = '@';
  gWaveModelTable[4][0x18] = '@';
  gWaveModelTable[4][0x19] = '@';
  gWaveModelTable[4][0x1a] = '@';
  gWaveModelTable[4][0x1b] = '@';
  gWaveModelTable[4][0x1c] = '@';
  gWaveModelTable[4][0x1d] = '@';
  gWaveModelTable[4][0x1e] = '@';
  gWaveModelTable[4][0x1f] = '@';
  gWaveModelTable[4][0] = '@';
  gWaveModelTable[4][1] = '@';
  gWaveModelTable[4][2] = '@';
  gWaveModelTable[4][3] = '@';
  gWaveModelTable[4][4] = '@';
  gWaveModelTable[4][5] = '@';
  gWaveModelTable[4][6] = '@';
  gWaveModelTable[4][7] = '@';
  gWaveModelTable[4][8] = '@';
  gWaveModelTable[4][9] = '@';
  gWaveModelTable[4][10] = '@';
  gWaveModelTable[4][0xb] = '@';
  gWaveModelTable[4][0xc] = '@';
  gWaveModelTable[4][0xd] = '@';
  gWaveModelTable[4][0xe] = '@';
  gWaveModelTable[4][0xf] = '@';
  gWaveModelTable[4][0x80] = -0x40;
  gWaveModelTable[4][0x81] = -0x40;
  gWaveModelTable[4][0x82] = -0x40;
  gWaveModelTable[4][0x83] = -0x40;
  gWaveModelTable[4][0x84] = -0x40;
  gWaveModelTable[4][0x85] = -0x40;
  gWaveModelTable[4][0x86] = -0x40;
  gWaveModelTable[4][0x87] = -0x40;
  gWaveModelTable[4][0x88] = -0x40;
  gWaveModelTable[4][0x89] = -0x40;
  gWaveModelTable[4][0x8a] = -0x40;
  gWaveModelTable[4][0x8b] = -0x40;
  gWaveModelTable[4][0x8c] = -0x40;
  gWaveModelTable[4][0x8d] = -0x40;
  gWaveModelTable[4][0x8e] = -0x40;
  gWaveModelTable[4][0x8f] = -0x40;
  gWaveModelTable[4][0x90] = -0x40;
  gWaveModelTable[4][0x91] = -0x40;
  gWaveModelTable[4][0x92] = -0x40;
  gWaveModelTable[4][0x93] = -0x40;
  gWaveModelTable[4][0x94] = -0x40;
  gWaveModelTable[4][0x95] = -0x40;
  gWaveModelTable[4][0x96] = -0x40;
  gWaveModelTable[4][0x97] = -0x40;
  gWaveModelTable[4][0x98] = -0x40;
  gWaveModelTable[4][0x99] = -0x40;
  gWaveModelTable[4][0x9a] = -0x40;
  gWaveModelTable[4][0x9b] = -0x40;
  gWaveModelTable[4][0x9c] = -0x40;
  gWaveModelTable[4][0x9d] = -0x40;
  gWaveModelTable[4][0x9e] = -0x40;
  gWaveModelTable[4][0x9f] = -0x40;
  gWaveModelTable[4][0xa0] = -0x40;
  gWaveModelTable[4][0xa1] = -0x40;
  gWaveModelTable[4][0xa2] = -0x40;
  gWaveModelTable[4][0xa3] = -0x40;
  gWaveModelTable[4][0xa4] = -0x40;
  gWaveModelTable[4][0xa5] = -0x40;
  gWaveModelTable[4][0xa6] = -0x40;
  gWaveModelTable[4][0xa7] = -0x40;
  gWaveModelTable[4][0xa8] = -0x40;
  gWaveModelTable[4][0xa9] = -0x40;
  gWaveModelTable[4][0xaa] = -0x40;
  gWaveModelTable[4][0xab] = -0x40;
  gWaveModelTable[4][0xac] = -0x40;
  gWaveModelTable[4][0xad] = -0x40;
  gWaveModelTable[4][0xae] = -0x40;
  gWaveModelTable[4][0xaf] = -0x40;
  gWaveModelTable[4][0xb0] = -0x40;
  gWaveModelTable[4][0xb1] = -0x40;
  gWaveModelTable[4][0xb2] = -0x40;
  gWaveModelTable[4][0xb3] = -0x40;
  gWaveModelTable[4][0xb4] = -0x40;
  gWaveModelTable[4][0xb5] = -0x40;
  gWaveModelTable[4][0xb6] = -0x40;
  gWaveModelTable[4][0xb7] = -0x40;
  gWaveModelTable[4][0xb8] = -0x40;
  gWaveModelTable[4][0xb9] = -0x40;
  gWaveModelTable[4][0xba] = -0x40;
  gWaveModelTable[4][0xbb] = -0x40;
  gWaveModelTable[4][0xbc] = -0x40;
  gWaveModelTable[4][0xbd] = -0x40;
  gWaveModelTable[4][0xbe] = -0x40;
  gWaveModelTable[4][0xbf] = -0x40;
  gWaveModelTable[4][0xc0] = -0x40;
  gWaveModelTable[4][0xc1] = -0x40;
  gWaveModelTable[4][0xc2] = -0x40;
  gWaveModelTable[4][0xc3] = -0x40;
  gWaveModelTable[4][0xc4] = -0x40;
  gWaveModelTable[4][0xc5] = -0x40;
  gWaveModelTable[4][0xc6] = -0x40;
  gWaveModelTable[4][199] = -0x40;
  gWaveModelTable[4][200] = -0x40;
  gWaveModelTable[4][0xc9] = -0x40;
  gWaveModelTable[4][0xca] = -0x40;
  gWaveModelTable[4][0xcb] = -0x40;
  gWaveModelTable[4][0xcc] = -0x40;
  gWaveModelTable[4][0xcd] = -0x40;
  gWaveModelTable[4][0xce] = -0x40;
  gWaveModelTable[4][0xcf] = -0x40;
  gWaveModelTable[4][0xd0] = -0x40;
  gWaveModelTable[4][0xd1] = -0x40;
  gWaveModelTable[4][0xd2] = -0x40;
  gWaveModelTable[4][0xd3] = -0x40;
  gWaveModelTable[4][0xd4] = -0x40;
  gWaveModelTable[4][0xd5] = -0x40;
  gWaveModelTable[4][0xd6] = -0x40;
  gWaveModelTable[4][0xd7] = -0x40;
  gWaveModelTable[4][0xd8] = -0x40;
  gWaveModelTable[4][0xd9] = -0x40;
  gWaveModelTable[4][0xda] = -0x40;
  gWaveModelTable[4][0xdb] = -0x40;
  gWaveModelTable[4][0xdc] = -0x40;
  gWaveModelTable[4][0xdd] = -0x40;
  gWaveModelTable[4][0xde] = -0x40;
  gWaveModelTable[4][0xdf] = -0x40;
  gWaveModelTable[4][0xe0] = -0x40;
  gWaveModelTable[4][0xe1] = -0x40;
  gWaveModelTable[4][0xe2] = -0x40;
  gWaveModelTable[4][0xe3] = -0x40;
  gWaveModelTable[4][0xe4] = -0x40;
  gWaveModelTable[4][0xe5] = -0x40;
  gWaveModelTable[4][0xe6] = -0x40;
  gWaveModelTable[4][0xe7] = -0x40;
  gWaveModelTable[4][0xe8] = -0x40;
  gWaveModelTable[4][0xe9] = -0x40;
  gWaveModelTable[4][0xea] = -0x40;
  gWaveModelTable[4][0xeb] = -0x40;
  gWaveModelTable[4][0xec] = -0x40;
  gWaveModelTable[4][0xed] = -0x40;
  gWaveModelTable[4][0xee] = -0x40;
  gWaveModelTable[4][0xef] = -0x40;
  gWaveModelTable[4][0xf0] = -0x40;
  gWaveModelTable[4][0xf1] = -0x40;
  gWaveModelTable[4][0xf2] = -0x40;
  gWaveModelTable[4][0xf3] = -0x40;
  gWaveModelTable[4][0xf4] = -0x40;
  gWaveModelTable[4][0xf5] = -0x40;
  gWaveModelTable[4][0xf6] = -0x40;
  gWaveModelTable[4][0xf7] = -0x40;
  gWaveModelTable[4][0xf8] = -0x40;
  gWaveModelTable[4][0xf9] = -0x40;
  gWaveModelTable[4][0xfa] = -0x40;
  gWaveModelTable[4][0xfb] = -0x40;
  gWaveModelTable[4][0xfc] = -0x40;
  gWaveModelTable[4][0xfd] = -0x40;
  gWaveModelTable[4][0xfe] = -0x40;
  gWaveModelTable[4][0xff] = -0x40;
  lVar5 = 0;
  msvc_srand(0);
  do {
    iVar3 = msvc_rand();
    gWaveModelTable[5][lVar5] = (char)((uint)(byte)((byte)iVar3 >> 7) + (int)(char)(byte)iVar3 >> 1)
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  return;
}

Assistant:

void MakeWaveTables(void)
{
	int i;

	int a;

	// Sine wave
	for (i = 0; i < 0x100; ++i)
	{
		gWaveModelTable[0][i] = (signed char)(sin((i * 6.283184) / 256.0) * 64.0);
		a = gWaveModelTable[0][i];	// I have no idea what this line was meant to do
	}

	// Triangle wave
	for (a = 0, i = 0; i < 0x40; ++i)
	{
		// Upwards
		gWaveModelTable[1][i] = (a * 0x40) / 0x40;
		++a;
	}
	for (a = 0; i < 0xC0; ++i)
	{
		// Downwards
		gWaveModelTable[1][i] = 0x40 - ((a * 0x40) / 0x40);
		++a;
	}
	for (a = 0; i < 0x100; ++i)
	{
		// Back up
		gWaveModelTable[1][i] = ((a * 0x40) / 0x40) - 0x40;
		++a;
	}

	// Saw up wave
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[2][i] = (i / 2) - 0x40;

	// Saw down wave
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[3][i] = 0x40 - (i / 2);

	// Square wave
	for (i = 0; i < 0x80; ++i)
		gWaveModelTable[4][i] = 0x40;
	for (; i < 0x100; ++i)
		gWaveModelTable[4][i] = -0x40;

	// White noise wave
	msvc_srand(0);
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[5][i] = (signed char)(msvc_rand() & 0xFF) / 2;
}